

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::javanano::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,".protodevel",&local_39);
  bVar1 = HasSuffixString(filename,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,".protodevel",&local_39);
    StripSuffixString(__return_storage_ptr__,filename,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,".proto",&local_39);
    StripSuffixString(__return_storage_ptr__,filename,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string StripProto(const string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}